

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

void __thiscall Deck::draw(Deck *this,Hand *userHand)

{
  reference pvVar1;
  size_type sVar2;
  vector<CardType,_std::allocator<CardType>_> *this_00;
  value_type local_1c;
  Hand *pHStack_18;
  CardType drawnCard;
  Hand *userHand_local;
  Deck *this_local;
  
  pHStack_18 = userHand;
  userHand_local = (Hand *)this;
  pvVar1 = std::vector<CardType,_std::allocator<CardType>_>::back(this->deckPointer);
  local_1c = *pvVar1;
  std::vector<CardType,_std::allocator<CardType>_>::pop_back(this->deckPointer);
  sVar2 = std::vector<CardType,_std::allocator<CardType>_>::size(this->deckPointer);
  setNumberOfCards(this,(int)sVar2);
  this_00 = Hand::getHand(pHStack_18);
  std::vector<CardType,_std::allocator<CardType>_>::push_back(this_00,&local_1c);
  return;
}

Assistant:

void Deck::draw(Hand& userHand) {
    CardType drawnCard = deckPointer->back();
    deckPointer->pop_back();
    Deck::setNumberOfCards(deckPointer->size());
    userHand.getHand()->push_back(drawnCard);
}